

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

string * __thiscall
libtorrent::dht_pkt_alert::message_abi_cxx11_(string *__return_storage_ptr__,dht_pkt_alert *this)

{
  char *pcVar1;
  char *pcVar2;
  index_type iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  endpoint *ep;
  int indent;
  span<const_char> sVar6;
  allocator<char> local_4c9;
  string local_4c8;
  char local_4a8 [8];
  char buf [1024];
  string msg;
  undefined1 local_78 [8];
  span<const_char> pkt;
  error_code ec;
  bdecode_node print;
  dht_pkt_alert *this_local;
  
  bdecode_node::bdecode_node((bdecode_node *)&ec.cat_);
  boost::system::error_code::error_code((error_code *)&pkt.m_len);
  sVar6 = pkt_buf(this);
  pkt.m_ptr = (char *)sVar6.m_len;
  local_78 = (undefined1  [8])sVar6.m_ptr;
  pcVar1 = span<const_char>::data((span<const_char> *)local_78);
  pcVar2 = span<const_char>::data((span<const_char> *)local_78);
  iVar3 = span<const_char>::size((span<const_char> *)local_78);
  indent = 0;
  bdecode(pcVar1,pcVar2 + (int)iVar3,(bdecode_node *)&ec.cat_,(error_code *)&pkt.m_len,(int *)0x0,
          100,100);
  print_entry_abi_cxx11_
            ((string *)(buf + 0x3f8),(libtorrent *)&ec.cat_,(bdecode_node *)0x1,false,indent);
  pcVar1 = message::prefix[this->direction];
  print_endpoint_abi_cxx11_(&local_4c8,(libtorrent *)&this->node,ep);
  uVar4 = std::__cxx11::string::c_str();
  uVar5 = std::__cxx11::string::c_str();
  snprintf(local_4a8,0x400,"%s [%s] %s",pcVar1,uVar4,uVar5);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_4a8,&local_4c9);
  std::allocator<char>::~allocator(&local_4c9);
  std::__cxx11::string::~string((string *)(buf + 0x3f8));
  bdecode_node::~bdecode_node((bdecode_node *)&ec.cat_);
  return __return_storage_ptr__;
}

Assistant:

std::string dht_pkt_alert::message() const
	{
		bdecode_node print;
		error_code ec;

		// ignore errors here. This is best-effort. It may be a broken encoding
		// but at least we'll print the valid parts
		span<char const> pkt = pkt_buf();
		bdecode(pkt.data(), pkt.data() + int(pkt.size()), print, ec, nullptr, 100, 100);

		std::string msg = print_entry(print, true);

		static char const* const prefix[2] = {"<==", "==>"};
		char buf[1024];
		std::snprintf(buf, sizeof(buf), "%s [%s] %s", prefix[direction]
			, print_endpoint(node).c_str(), msg.c_str());

		return buf;
	}